

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

bool duckdb_yyjson::unsafe_yyjson_mut_ptr_putx
               (yyjson_mut_val *val,char *ptr,size_t ptr_len,yyjson_mut_val *new_val,
               yyjson_mut_doc *doc,bool create_parent,bool insert_new,yyjson_ptr_ctx *ctx,
               yyjson_ptr_err *err)

{
  yyjson_val_pool *pyVar1;
  yyjson_str_pool *pyVar2;
  byte *pbVar3;
  yyjson_alc *alc;
  undefined8 uVar4;
  ulong *puVar5;
  yyjson_mut_val *pyVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  yyjson_val_uni yVar10;
  yyjson_val_uni yVar11;
  yyjson_mut_val *pyVar12;
  long lVar13;
  ulong uVar14;
  ulong *puVar15;
  yyjson_mut_doc *pyVar16;
  byte bVar17;
  byte *pbVar18;
  ulong uVar19;
  yyjson_mut_val *pyVar20;
  byte *pbVar21;
  yyjson_mut_doc *pyVar22;
  undefined7 in_register_00000089;
  byte *pbVar23;
  byte *__s2;
  yyjson_mut_val *pyVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  yyjson_mut_val *pyVar28;
  ulong *local_a8;
  yyjson_mut_val *local_88;
  yyjson_mut_doc *local_80;
  ulong local_78;
  long local_50;
  byte local_48;
  byte local_39;
  
  local_50 = CONCAT71(in_register_00000089,create_parent);
  pbVar18 = (byte *)(ptr + ptr_len);
  bVar7 = false;
  pbVar21 = (byte *)ptr;
  local_80 = doc;
  do {
    pyVar28 = val;
    __s2 = pbVar21 + 1;
    for (pbVar21 = __s2; ((pbVar21 < pbVar18 && (*pbVar21 != 0x2f)) && (*pbVar21 != 0x7e));
        pbVar21 = pbVar21 + 1) {
    }
    if ((pbVar21 == pbVar18) || (*pbVar21 != 0x7e)) {
      local_80 = (yyjson_mut_doc *)(pbVar21 + -(long)__s2);
      local_50 = 0;
    }
    else {
      if (pbVar21 < pbVar18) {
        lVar13 = 0;
        do {
          pbVar23 = pbVar21 + 1;
          if (*pbVar21 == 0x2f) break;
          if (*pbVar21 == 0x7e) {
            if ((pbVar23 == pbVar18) || ((*pbVar23 & 0xfe) != 0x30)) {
              __s2 = (byte *)0x0;
              goto LAB_018b72c6;
            }
            lVar13 = lVar13 + 1;
          }
          pbVar21 = pbVar23;
        } while (pbVar23 < pbVar18);
      }
      else {
        lVar13 = 0;
      }
      local_80 = (yyjson_mut_doc *)(pbVar21 + (-(long)__s2 - lVar13));
      local_50 = lVar13;
    }
LAB_018b72c6:
    if (__s2 == (byte *)0x0) {
      if (err != (yyjson_ptr_err *)0x0) {
        err->code = 2;
        err->msg = "invalid escaped character";
        err->pos = (long)pbVar21 - (long)ptr;
      }
      goto LAB_018b7b7d;
    }
    uVar19 = pyVar28->tag;
    local_48 = (byte)uVar19 & 7;
    if (((byte)uVar19 & 7) == 6) {
      if (uVar19 < 0x100) {
        if (local_80 == (yyjson_mut_doc *)&DAT_00000001) {
          if ((*__s2 == 0x30) || (*__s2 == 0x2d)) {
            bVar7 = true;
          }
          else {
            bVar7 = false;
          }
          pyVar12 = (yyjson_mut_val *)0x0;
          val = (yyjson_mut_val *)0x0;
          goto LAB_018b74f7;
        }
      }
      else {
        uVar25 = local_78;
        if ((undefined1 *)((long)&local_80[-1].val_pool.chunk_size + 4U) <
            (undefined1 *)0xffffffffffffffed) {
          bVar7 = false;
        }
        else {
          if (*__s2 == 0x2d) {
            uVar26 = 0xffffffffffffffff;
          }
          else {
            if (*__s2 != 0x30) {
              bVar7 = (long)local_80 < 1;
              if (((long)local_80 < 1) || (uVar26 = (ulong)*__s2 - 0x30, 9 < uVar26)) {
                uVar14 = 0;
              }
              else {
                uVar14 = 0;
                pbVar23 = __s2;
                do {
                  pbVar23 = pbVar23 + 1;
                  uVar14 = uVar26 + uVar14 * 10;
                  bVar7 = __s2 + (long)local_80 <= pbVar23;
                  if (bVar7) break;
                  uVar26 = (ulong)*pbVar23 - 0x30;
                } while (uVar26 < 10);
              }
              bVar7 = (bool)(uVar14 != 0 & bVar7);
              if (bVar7) {
                uVar25 = uVar14;
              }
              goto LAB_018b748f;
            }
            uVar26 = 0;
          }
          bVar7 = local_80 < (yyjson_mut_doc *)0x2;
          if (bVar7) {
            uVar25 = uVar26;
          }
        }
LAB_018b748f:
        local_78 = uVar25;
        if (bVar7) {
          bVar7 = uVar25 == 0xffffffffffffffff || uVar25 == uVar19 >> 8;
          if (uVar19 >> 8 <= uVar25) goto LAB_018b7302;
          pyVar12 = (yyjson_mut_val *)(pyVar28->uni).u64;
          local_78 = uVar25 - 1;
          if (uVar25 != 0) {
            do {
              pyVar12 = pyVar12->next;
              uVar25 = uVar25 - 1;
            } while (uVar25 != 0);
            local_78 = 0xffffffffffffffff;
          }
          val = pyVar12->next;
          goto LAB_018b74f7;
        }
      }
      bVar7 = false;
LAB_018b7302:
      pyVar12 = (yyjson_mut_val *)0x0;
      val = (yyjson_mut_val *)0x0;
    }
    else {
      if (((uint)uVar19 & 7) != 7) goto joined_r0x018b8146;
      if (uVar19 < 0x100) goto LAB_018b7302;
      uVar19 = uVar19 >> 8;
      pyVar12 = (yyjson_mut_val *)(pyVar28->uni).u64;
      do {
        pyVar24 = pyVar12->next->next;
        if ((yyjson_mut_doc *)(pyVar24->tag >> 8) == local_80) {
          if (local_50 == 0) {
            iVar9 = bcmp((pyVar24->uni).ptr,__s2,(size_t)local_80);
            bVar8 = iVar9 == 0;
          }
          else {
            bVar8 = local_80 == (yyjson_mut_doc *)0x0;
            if (local_80 != (yyjson_mut_doc *)0x0) {
              pyVar22 = (yyjson_mut_doc *)0x0;
              pbVar23 = __s2;
              do {
                if (*pbVar23 == 0x7e) {
                  bVar17 = 0x2f;
                  if (pbVar23[1] == 0x30) {
                    bVar17 = 0x7e;
                  }
                  if (bVar17 != (pyVar24->uni).str[(long)pyVar22]) goto LAB_018b73bd;
                  pbVar23 = pbVar23 + 1;
                }
                else if ((pyVar24->uni).str[(long)pyVar22] != *pbVar23) goto LAB_018b73bd;
                pbVar23 = pbVar23 + 1;
                pyVar22 = (yyjson_mut_doc *)((long)&pyVar22->root + 1);
                bVar8 = local_80 == pyVar22;
              } while (!bVar8);
            }
          }
          if (bVar8) {
            val = pyVar24->next;
            goto LAB_018b74f7;
          }
        }
LAB_018b73bd:
        uVar19 = uVar19 - 1;
        pyVar12 = pyVar24;
      } while (uVar19 != 0);
      pyVar12 = (yyjson_mut_val *)0x0;
      val = (yyjson_mut_val *)0x0;
    }
LAB_018b74f7:
  } while ((pbVar21 != pbVar18) && (val != (yyjson_mut_val *)0x0));
  if (pbVar21 == pbVar18) {
LAB_018b75e5:
    uVar19 = pyVar28->tag;
    if (local_48 == 7) {
      if (ctx != (yyjson_ptr_ctx *)0x0) {
        ctx->ctn = pyVar28;
      }
      if (val != (yyjson_mut_val *)0x0 && !insert_new) {
        pyVar24 = pyVar12->next->next;
        if (ctx != (yyjson_ptr_ctx *)0x0) {
          ctx->pre = pyVar12;
          ctx->old = val;
        }
        if ((((~(uint)uVar19 & 7) == 0) && (pyVar24 != (yyjson_mut_val *)0x0)) &&
           ((pyVar24->tag & 7) == 5)) {
          if (uVar19 < 0x100) {
            puVar15 = (ulong *)0x0;
          }
          else {
            puVar15 = (ulong *)(pyVar28->uni).u64;
          }
          uVar19 = uVar19 >> 8;
          uVar26 = pyVar24->tag >> 8;
          local_a8 = (ulong *)0x0;
          bVar7 = false;
          uVar25 = 0;
LAB_018b794f:
          do {
            do {
              do {
                if (uVar25 < uVar19) {
                  puVar27 = *(ulong **)(puVar15[2] + 0x10);
                  uVar25 = uVar25 + 1;
                  puVar5 = puVar27;
                  local_a8 = puVar15;
                }
                else {
                  puVar27 = (ulong *)0x0;
                  puVar5 = puVar15;
                }
                puVar15 = puVar5;
                if (puVar27 == (ulong *)0x0) {
                  if (new_val != (yyjson_mut_val *)0x0 && !bVar7) {
                    unsafe_yyjson_mut_ptr_putx();
                  }
                  goto LAB_018b7746;
                }
              } while ((*puVar27 >> 8 != uVar26) ||
                      (iVar9 = bcmp((void *)puVar27[1],(pyVar24->uni).ptr,uVar26), iVar9 != 0));
              if (new_val != (yyjson_mut_val *)0x0 && !bVar7) {
                new_val->next = *(yyjson_mut_val **)(puVar27[2] + 0x10);
                puVar27[2] = (ulong)new_val;
                bVar7 = true;
                goto LAB_018b794f;
              }
            } while (uVar19 <= uVar25 - 1);
            uVar4 = *(undefined8 *)(puVar15[2] + 0x10);
            if (uVar25 == uVar19) {
              (pyVar28->uni).u64 = (uint64_t)local_a8;
            }
            uVar19 = uVar19 - 1;
            pyVar28->tag = uVar19 * 0x100 | (ulong)(byte)pyVar28->tag;
            *(undefined8 *)(local_a8[2] + 0x10) = uVar4;
            puVar15 = local_a8;
            uVar25 = uVar25 - 1;
          } while( true );
        }
        goto LAB_018b7746;
      }
      if (local_50 == 0) {
        if (doc == (yyjson_mut_doc *)0x0) goto LAB_018b7c68;
        pyVar1 = &doc->val_pool;
        if (((doc->val_pool).end != (doc->val_pool).cur) ||
           (bVar7 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1), bVar7)) {
          yVar11.str = (char *)pyVar1->cur;
          pyVar1->cur = (yyjson_mut_val *)(yVar11.u64 + 0x18);
        }
        else {
          yVar11.u64 = 0;
        }
        pyVar2 = &doc->str_pool;
        if ((local_80 < (yyjson_mut_doc *)((doc->str_pool).end + -(long)(doc->str_pool).cur)) ||
           (bVar7 = unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,(usize)((long)&local_80->root + 1))
           , bVar7)) {
          pbVar18 = (byte *)pyVar2->cur;
          pyVar2->cur = (char *)(pbVar18 + (long)local_80 + 1);
        }
        else {
          pbVar18 = (byte *)0x0;
        }
        if (pbVar18 == (byte *)0x0) {
          pbVar18 = (byte *)0x0;
        }
        else {
          switchD_012dd528::default(pbVar18,__s2,(size_t)local_80);
          pbVar18[(long)local_80] = 0;
        }
        yVar10.u64 = 0;
        if ((yVar11.u64 != 0) && (pbVar18 != (byte *)0x0)) {
LAB_018b76c9:
          yVar10 = yVar11;
          *(ulong *)yVar10.str = (long)local_80 << 8 | 5;
          *(byte **)(yVar10.u64 + 8) = pbVar18;
        }
      }
      else {
        pbVar21 = (byte *)((long)&local_80->root + local_50);
        pyVar2 = &doc->str_pool;
        if ((pbVar21 < (doc->str_pool).end + -(long)(doc->str_pool).cur) ||
           (bVar7 = unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,(usize)(pbVar21 + 1)), bVar7)) {
          pbVar18 = (byte *)pyVar2->cur;
          pyVar2->cur = (char *)(pbVar18 + (long)(pbVar21 + 1));
        }
        else {
          pbVar18 = (byte *)0x0;
        }
        if (pbVar18 != (byte *)0x0) {
          pbVar23 = __s2 + local_50;
          pbVar21 = pbVar18;
          if (__s2 < pbVar23 + (long)local_80) {
            do {
              bVar17 = *__s2;
              if (*__s2 == 0x7e) {
                pbVar3 = __s2 + 1;
                __s2 = __s2 + 1;
                bVar17 = 0x2f;
                if (*pbVar3 == 0x30) {
                  bVar17 = 0x7e;
                }
              }
              *pbVar21 = bVar17;
              __s2 = __s2 + 1;
              pbVar21 = pbVar21 + 1;
            } while (__s2 < pbVar23 + (long)local_80);
          }
          *pbVar21 = 0;
          if (doc != (yyjson_mut_doc *)0x0) {
            pyVar1 = &doc->val_pool;
            if (((doc->val_pool).end != (doc->val_pool).cur) ||
               (bVar7 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1), bVar7)) {
              yVar11.str = (char *)pyVar1->cur;
              pyVar1->cur = (yyjson_mut_val *)(yVar11.u64 + 0x18);
            }
            else {
              yVar11.u64 = 0;
            }
            if (yVar11.u64 != 0) goto LAB_018b76c9;
            yVar10.u64 = 0;
            goto LAB_018b76db;
          }
        }
LAB_018b7c68:
        yVar10.u64 = 0;
      }
LAB_018b76db:
      if (yVar10.u64 == 0) goto joined_r0x018b8111;
      if (ctx != (yyjson_ptr_ctx *)0x0) {
        yVar11 = yVar10;
        if (0xff < uVar19) {
          yVar11 = pyVar28->uni;
        }
        ctx->pre = (yyjson_mut_val *)yVar11;
      }
      yVar11 = yVar10;
      if (0xff < uVar19) {
        lVar13 = *(long *)((pyVar28->uni).u64 + 0x10);
        yVar11 = *(yyjson_val_uni *)(lVar13 + 0x10);
        ((yyjson_val_uni *)(lVar13 + 0x10))->u64 = (uint64_t)yVar10;
      }
      new_val->next = (yyjson_mut_val *)yVar11;
      *(yyjson_mut_val **)(yVar10.u64 + 0x10) = new_val;
      (pyVar28->uni).u64 = (uint64_t)yVar10;
      pyVar28->tag = (ulong)(byte)pyVar28->tag + (uVar19 & 0xffffffffffffff00) + 0x100;
    }
    else {
      if ((ctx != (yyjson_ptr_ctx *)0x0) && ((val != (yyjson_mut_val *)0x0 || (bVar7 != false)))) {
        ctx->ctn = pyVar28;
      }
      if (insert_new) {
        if (val == (yyjson_mut_val *)0x0) {
          if (bVar7 == false) goto joined_r0x018b8146;
          if (ctx != (yyjson_ptr_ctx *)0x0) {
            yVar11 = (yyjson_val_uni)new_val;
            if (0xff < uVar19) {
              yVar11 = pyVar28->uni;
            }
            ctx->pre = (yyjson_mut_val *)yVar11;
          }
          if ((new_val != (yyjson_mut_val *)0x0) && (((uint)uVar19 & 7) == 6)) {
            pyVar28->tag = (uVar19 & 0xfffffffffffffffe) + 0x100;
            pyVar12 = new_val;
            if (0xff < uVar19) {
              pyVar12 = *(yyjson_mut_val **)((pyVar28->uni).u64 + 0x10);
              *(yyjson_mut_val **)((pyVar28->uni).u64 + 0x10) = new_val;
            }
            new_val->next = pyVar12;
            (pyVar28->uni).str = (char *)new_val;
          }
        }
        else {
          pyVar12->next = new_val;
          new_val->next = val;
          if (ctx != (yyjson_ptr_ctx *)0x0) {
            ctx->pre = pyVar12;
          }
          pyVar28->tag = uVar19 + 0x100;
        }
      }
      else {
        if (val == (yyjson_mut_val *)0x0) {
joined_r0x018b8146:
          if (err != (yyjson_ptr_err *)0x0) {
            err->code = 3;
            err->msg = "JSON pointer cannot be resolved";
            err->pos = (long)__s2 - (long)ptr;
          }
          goto LAB_018b7b7d;
        }
        if (uVar19 < 0x200) {
          new_val->next = new_val;
          pyVar12 = new_val;
LAB_018b790e:
          (pyVar28->uni).str = (char *)new_val;
        }
        else {
          new_val->next = val->next;
          pyVar12->next = new_val;
          if ((yyjson_mut_val *)(pyVar28->uni).u64 == val) goto LAB_018b790e;
        }
        if (ctx != (yyjson_ptr_ctx *)0x0) {
          ctx->pre = pyVar12;
          ctx->old = val;
        }
      }
    }
LAB_018b7746:
    unsafe_yyjson_mut_ptr_putx();
  }
  else {
    if (!create_parent) goto joined_r0x018b8146;
    if (local_48 != 6) {
      local_88 = (yyjson_mut_val *)0x0;
      pyVar24 = pyVar28;
LAB_018b7cf7:
      pyVar28 = pyVar24;
      if (pbVar21 != pbVar18) {
        pyVar2 = &doc->str_pool;
        alc = &doc->alc;
        pyVar1 = &doc->val_pool;
        pyVar22 = local_80;
        lVar13 = local_50;
        do {
          if (lVar13 == 0) {
            if (doc != (yyjson_mut_doc *)0x0) {
              if (((doc->val_pool).end != (doc->val_pool).cur) ||
                 (bVar8 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1), bVar8)) {
                pyVar28 = pyVar1->cur;
                pyVar1->cur = pyVar28 + 1;
              }
              else {
                pyVar28 = (yyjson_mut_val *)0x0;
              }
              if ((pyVar22 < (yyjson_mut_doc *)((doc->str_pool).end + -(long)(doc->str_pool).cur))
                 || (bVar8 = unsafe_yyjson_str_pool_grow
                                       (pyVar2,alc,(usize)((long)&pyVar22->root + 1)), bVar8)) {
                local_80 = (yyjson_mut_doc *)pyVar2->cur;
                pyVar2->cur = (char *)((byte *)((long)local_80 + (long)pyVar22) + 1);
              }
              else {
                local_80 = (yyjson_mut_doc *)0x0;
              }
              if (local_80 == (yyjson_mut_doc *)0x0) {
                local_80 = (yyjson_mut_doc *)0x0;
              }
              else {
                switchD_012dd528::default(local_80,__s2,(size_t)pyVar22);
                *(byte *)((long)local_80 + (long)pyVar22) = 0;
              }
              if (pyVar28 != (yyjson_mut_val *)0x0) {
                pyVar20 = (yyjson_mut_val *)0x0;
                if (local_80 != (yyjson_mut_doc *)0x0) {
LAB_018b7dc5:
                  pyVar20 = pyVar28;
                  pyVar20->tag = (long)pyVar22 << 8 | 5;
                  (pyVar20->uni).str = (char *)local_80;
                }
                goto LAB_018b7dd7;
              }
            }
LAB_018b7f98:
            pyVar20 = (yyjson_mut_val *)0x0;
          }
          else {
            pbVar23 = (byte *)((long)&pyVar22->root + lVar13);
            if ((pbVar23 < (doc->str_pool).end + -(long)(doc->str_pool).cur) ||
               (bVar8 = unsafe_yyjson_str_pool_grow(pyVar2,alc,(usize)(pbVar23 + 1)), bVar8)) {
              local_80 = (yyjson_mut_doc *)pyVar2->cur;
              pyVar2->cur = (char *)((long)local_80 + (long)(pbVar23 + 1));
            }
            else {
              local_80 = (yyjson_mut_doc *)0x0;
            }
            if (local_80 != (yyjson_mut_doc *)0x0) {
              pbVar23 = __s2 + (long)pyVar22;
              pyVar16 = local_80;
              for (; __s2 < pbVar23 + lVar13; __s2 = __s2 + 1) {
                bVar17 = *__s2;
                if (*__s2 == 0x7e) {
                  pbVar3 = __s2 + 1;
                  __s2 = __s2 + 1;
                  bVar17 = 0x2f;
                  if (*pbVar3 == 0x30) {
                    bVar17 = 0x7e;
                  }
                }
                *(byte *)pyVar16 = bVar17;
                pyVar16 = (yyjson_mut_doc *)((long)pyVar16 + 1);
              }
              *(byte *)pyVar16 = 0;
              if (doc != (yyjson_mut_doc *)0x0) {
                if (((doc->val_pool).end != (doc->val_pool).cur) ||
                   (bVar8 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1), bVar8)) {
                  pyVar28 = pyVar1->cur;
                  pyVar1->cur = pyVar28 + 1;
                }
                else {
                  pyVar28 = (yyjson_mut_val *)0x0;
                }
                if (pyVar28 != (yyjson_mut_val *)0x0) goto LAB_018b7dc5;
                goto LAB_018b7f98;
              }
            }
            pyVar20 = (yyjson_mut_val *)0x0;
          }
LAB_018b7dd7:
          if (pyVar20 == (yyjson_mut_val *)0x0) goto joined_r0x018b8111;
          if (doc == (yyjson_mut_doc *)0x0) {
            pyVar28 = (yyjson_mut_val *)0x0;
          }
          else {
            if (((doc->val_pool).end != (doc->val_pool).cur) ||
               (bVar8 = unsafe_yyjson_val_pool_grow(pyVar1,alc,1), bVar8)) {
              pyVar28 = pyVar1->cur;
              pyVar1->cur = pyVar28 + 1;
            }
            else {
              pyVar28 = (yyjson_mut_val *)0x0;
            }
            if (pyVar28 == (yyjson_mut_val *)0x0) {
              pyVar28 = (yyjson_mut_val *)0x0;
            }
            else {
              pyVar28->tag = 7;
            }
          }
          if (pyVar28 == (yyjson_mut_val *)0x0) goto joined_r0x018b8111;
          pyVar6 = pyVar24;
          if (((local_88 != (yyjson_mut_val *)0x0) &&
              (pyVar6 = local_88, (~(uint)pyVar24->tag & 7) == 0)) && ((pyVar20->tag & 7) == 5)) {
            unsafe_yyjson_mut_ptr_putx();
          }
          local_88 = pyVar6;
          __s2 = pbVar21 + 1;
          for (pbVar21 = __s2; ((pbVar21 < pbVar18 && (*pbVar21 != 0x2f)) && (*pbVar21 != 0x7e));
              pbVar21 = pbVar21 + 1) {
          }
          if ((pbVar21 == pbVar18) || (*pbVar21 != 0x7e)) {
            pyVar22 = (yyjson_mut_doc *)(pbVar21 + -(long)__s2);
            local_50 = 0;
          }
          else {
            if (pbVar21 < pbVar18) {
              local_50 = 0;
              do {
                pbVar23 = pbVar21 + 1;
                if (*pbVar21 == 0x2f) break;
                if (*pbVar21 == 0x7e) {
                  if ((pbVar23 == pbVar18) || ((*pbVar23 & 0xfe) != 0x30)) {
                    __s2 = (byte *)0x0;
                    local_50 = lVar13;
                    goto LAB_018b7eaf;
                  }
                  local_50 = local_50 + 1;
                }
                pbVar21 = pbVar23;
              } while (pbVar23 < pbVar18);
            }
            else {
              local_50 = 0;
            }
            pyVar22 = (yyjson_mut_doc *)(pbVar21 + (-(long)__s2 - local_50));
          }
LAB_018b7eaf:
          if (__s2 == (byte *)0x0) {
            if (err != (yyjson_ptr_err *)0x0) {
              err->code = 2;
              err->msg = "invalid escaped character";
              err->pos = (long)pbVar21 - (long)ptr;
            }
            goto LAB_018b7b7d;
          }
          lVar13 = local_50;
          pyVar24 = pyVar28;
        } while (pbVar21 != pbVar18);
        val = (yyjson_mut_val *)0x0;
        local_80 = pyVar22;
      }
      goto LAB_018b75e5;
    }
    if ((insert_new & bVar7) == 0) goto joined_r0x018b8146;
    if (doc == (yyjson_mut_doc *)0x0) {
LAB_018b825a:
      pyVar24 = (yyjson_mut_val *)0x0;
    }
    else {
      pyVar1 = &doc->val_pool;
      if (((doc->val_pool).end != (doc->val_pool).cur) ||
         (bVar8 = unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1), bVar8)) {
        pyVar24 = pyVar1->cur;
        pyVar1->cur = pyVar24 + 1;
      }
      else {
        pyVar24 = (yyjson_mut_val *)0x0;
      }
      if (pyVar24 == (yyjson_mut_val *)0x0) goto LAB_018b825a;
      pyVar24->tag = 7;
    }
    if (pyVar24 != (yyjson_mut_val *)0x0) {
      __s2 = pbVar21 + 1;
      for (pbVar21 = __s2; ((pbVar21 < pbVar18 && (*pbVar21 != 0x2f)) && (*pbVar21 != 0x7e));
          pbVar21 = pbVar21 + 1) {
      }
      if ((pbVar21 == pbVar18) || (*pbVar21 != 0x7e)) {
        local_80 = (yyjson_mut_doc *)(pbVar21 + -(long)__s2);
        local_50 = 0;
      }
      else {
        if (pbVar21 < pbVar18) {
          lVar13 = 0;
          do {
            pbVar23 = pbVar21 + 1;
            if (*pbVar21 == 0x2f) break;
            if (*pbVar21 == 0x7e) {
              if ((pbVar23 == pbVar18) || ((*pbVar23 & 0xfe) != 0x30)) {
                __s2 = (byte *)0x0;
                goto LAB_018b7b32;
              }
              lVar13 = lVar13 + 1;
            }
            pbVar21 = pbVar23;
          } while (pbVar23 < pbVar18);
        }
        else {
          lVar13 = 0;
        }
        local_80 = (yyjson_mut_doc *)(pbVar21 + (-(long)__s2 - lVar13));
        local_50 = lVar13;
      }
LAB_018b7b32:
      if (__s2 == (byte *)0x0) goto joined_r0x018b8146;
      local_48 = 7;
      val = (yyjson_mut_val *)0x0;
      local_88 = pyVar28;
      goto LAB_018b7cf7;
    }
joined_r0x018b8111:
    if (err != (yyjson_ptr_err *)0x0) {
      err->code = 6;
      err->msg = "failed to create value";
      err->pos = 0;
    }
LAB_018b7b7d:
    local_39 = 0;
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool unsafe_yyjson_mut_ptr_putx(yyjson_mut_val *val,
                                const char *ptr, size_t ptr_len,
                                yyjson_mut_val *new_val,
                                yyjson_mut_doc *doc,
                                bool create_parent, bool insert_new,
                                yyjson_ptr_ctx *ctx,
                                yyjson_ptr_err *err) {

    const char *hdr = ptr, *end = ptr + ptr_len, *token;
    usize token_len, esc, ctn_len;
    yyjson_mut_val *ctn, *key, *pre = NULL;
    yyjson_mut_val *sep_ctn = NULL, *sep_key = NULL, *sep_val = NULL;
    yyjson_type ctn_type;
    bool idx_is_last = false;

    /* skip exist parent nodes */
    while (true) {
        token = ptr_next_token(&ptr, end, &token_len, &esc);
        if (unlikely(!token)) return_err_syntax(false, ptr - hdr);
        ctn = val;
        ctn_type = unsafe_yyjson_get_type(ctn);
        if (ctn_type == YYJSON_TYPE_OBJ) {
            val = ptr_mut_obj_get(ctn, token, token_len, esc, &pre);
        } else if (ctn_type == YYJSON_TYPE_ARR) {
            val = ptr_mut_arr_get(ctn, token, token_len, esc, &pre,
                                  &idx_is_last);
        } else return_err_resolve(false, token - hdr);
        if (!val) break;
        if (ptr == end) break; /* is last token */
    }

    /* create parent nodes if not exist */
    if (unlikely(ptr != end)) { /* not last token */
        if (!create_parent) return_err_resolve(false, token - hdr);

        /* add value at last index if container is array */
        if (ctn_type == YYJSON_TYPE_ARR) {
            if (!idx_is_last || !insert_new) {
                return_err_resolve(false, token - hdr);
            }
            val = yyjson_mut_obj(doc);
            if (!val) return_err_alloc(false);

            /* delay attaching until all operations are completed */
            sep_ctn = ctn;
            sep_key = NULL;
            sep_val = val;

            /* move to next token */
            ctn = val;
            val = NULL;
            ctn_type = YYJSON_TYPE_OBJ;
            token = ptr_next_token(&ptr, end, &token_len, &esc);
            if (unlikely(!token)) return_err_resolve(false, token - hdr);
        }

        /* container is object, create parent nodes */
        while (ptr != end) { /* not last token */
            key = ptr_new_key(token, token_len, esc, doc);
            if (!key) return_err_alloc(false);
            val = yyjson_mut_obj(doc);
            if (!val) return_err_alloc(false);

            /* delay attaching until all operations are completed */
            if (!sep_ctn) {
                sep_ctn = ctn;
                sep_key = key;
                sep_val = val;
            } else {
                yyjson_mut_obj_add(ctn, key, val);
            }

            /* move to next token */
            ctn = val;
            val = NULL;
            token = ptr_next_token(&ptr, end, &token_len, &esc);
            if (unlikely(!token)) return_err_syntax(false, ptr - hdr);
        }
    }

    /* JSON pointer is resolved, insert or replace target value */
    ctn_len = unsafe_yyjson_get_len(ctn);
    if (ctn_type == YYJSON_TYPE_OBJ) {
        if (ctx) ctx->ctn = ctn;
        if (!val || insert_new) {
            /* insert new key-value pair */
            key = ptr_new_key(token, token_len, esc, doc);
            if (unlikely(!key)) return_err_alloc(false);
            if (ctx) ctx->pre = ctn_len ? (yyjson_mut_val *)ctn->uni.ptr : key;
            unsafe_yyjson_mut_obj_add(ctn, key, new_val, ctn_len);
        } else {
            /* replace exist value */
            key = pre->next->next;
            if (ctx) ctx->pre = pre;
            if (ctx) ctx->old = val;
            yyjson_mut_obj_put(ctn, key, new_val);
        }
    } else {
        /* array */
        if (ctx && (val || idx_is_last)) ctx->ctn = ctn;
        if (insert_new) {
            /* append new value */
            if (val) {
                pre->next = new_val;
                new_val->next = val;
                if (ctx) ctx->pre = pre;
                unsafe_yyjson_set_len(ctn, ctn_len + 1);
            } else if (idx_is_last) {
                if (ctx) ctx->pre = ctn_len ?
                    (yyjson_mut_val *)ctn->uni.ptr : new_val;
                yyjson_mut_arr_append(ctn, new_val);
            } else {
                return_err_resolve(false, token - hdr);
            }
        } else {
            /* replace exist value */
            if (!val) return_err_resolve(false, token - hdr);
            if (ctn_len > 1) {
                new_val->next = val->next;
                pre->next = new_val;
                if (ctn->uni.ptr == val) ctn->uni.ptr = new_val;
            } else {
                new_val->next = new_val;
                ctn->uni.ptr = new_val;
                pre = new_val;
            }
            if (ctx) ctx->pre = pre;
            if (ctx) ctx->old = val;
        }
    }

    /* all operations are completed, attach the new components to the target */
    if (unlikely(sep_ctn)) {
        if (sep_key) yyjson_mut_obj_add(sep_ctn, sep_key, sep_val);
        else yyjson_mut_arr_append(sep_ctn, sep_val);
    }
    return true;
}